

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::VectorTest_VectorContainingVectors_Test::TestBody
          (VectorTest_VectorContainingVectors_Test *this)

{
  TagAndArray *pTVar1;
  size_t sVar2;
  bool bVar3;
  TagAndArray *pTVar4;
  unsigned_long *lhs;
  pointer *__ptr;
  Vector<unsigned_long> *this_00;
  char *pcVar5;
  char *in_R9;
  unsigned_long uVar6;
  unsigned_long elem_00;
  ulong uVar7;
  TagAndArray *pTVar8;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar__2;
  Vector<TagAndArray> local_278;
  TagAndArray *local_258;
  size_t count;
  Vector<TagAndArray> local_248;
  AssertionResult gtest_ar_4;
  TagAndArray extra;
  TagAndArray elem;
  TagAndArray local_70;
  TagAndArray local_50;
  
  local_248.capacity_ = 0;
  local_248.data_ = (TagAndArray *)0x0;
  local_248.size_ = 0;
  this_00 = &elem.vec;
  for (uVar6 = 0; uVar6 != 100; uVar6 = uVar6 + 1) {
    elem.vec.capacity_ = 0;
    elem.vec.data_ = (unsigned_long *)0x0;
    elem.vec.size_ = 0;
    elem.tag = uVar6;
    for (elem_00 = 0; uVar6 != elem_00; elem_00 = elem_00 + 1) {
      bVar3 = Vector<unsigned_long>::Push(this_00,elem_00);
      gtest_ar_.success_ = bVar3;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (!bVar3) {
        testing::Message::Message((Message *)&extra);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__2,(internal *)&gtest_ar_,
                   (AssertionResult *)"elem.vec.Push(j)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_278,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                   ,0x76,(char *)gtest_ar__2._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_278,(Message *)&extra);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_278);
        std::__cxx11::string::~string((string *)&gtest_ar__2);
        if (extra.tag != 0) {
          (**(code **)(*(long *)extra.tag + 8))();
        }
        goto LAB_002d30e0;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
    }
    TestBody::TagAndArray::TagAndArray(&local_50,&elem);
    bVar3 = Vector<TagAndArray>::Push(&local_248,&local_50);
    gtest_ar_.success_ = bVar3;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    Vector<unsigned_long>::~Vector(&local_50.vec);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&extra);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2,(internal *)&gtest_ar_,
                 (AssertionResult *)"vec.Push(std::move(elem))","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_278,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                 ,0x78,(char *)gtest_ar__2._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_278,(Message *)&extra);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_278);
      std::__cxx11::string::~string((string *)&gtest_ar__2);
      if (extra.tag != 0) {
        (**(code **)(*(long *)extra.tag + 8))();
      }
LAB_002d30e0:
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      goto LAB_002d30e8;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    Vector<unsigned_long>::~Vector(this_00);
  }
  gtest_ar__2._0_8_ = local_248.size_;
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&elem,"vec.size()","100u",(unsigned_long *)&gtest_ar__2,(uint *)&gtest_ar_)
  ;
  if ((char)elem.tag == '\0') {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (elem.vec.data_ == (unsigned_long *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*elem.vec.data_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x7a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&elem.vec);
  extra.vec.data_ = (unsigned_long *)0x0;
  extra.vec.size_ = 0;
  extra.vec.capacity_ = 0;
  extra.tag = 0x4d2;
  bVar3 = Vector<unsigned_long>::Push(&extra.vec,0x4d2);
  gtest_ar__2.success_ = bVar3;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar3) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__2.message_);
    TestBody::TagAndArray::TagAndArray(&local_70,&extra);
    bVar3 = Vector<TagAndArray>::Push(&local_248,&local_70);
    gtest_ar__2.success_ = bVar3;
    gtest_ar__2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    Vector<unsigned_long>::~Vector(&local_70.vec);
    if (gtest_ar__2.success_ != false) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__2.message_);
      sVar2 = local_248.size_;
      gtest_ar__2._0_8_ = local_248.size_;
      gtest_ar_.success_ = true;
      gtest_ar_._1_3_ = 0;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                ((internal *)&elem,"vec.size()","101u",(unsigned_long *)&gtest_ar__2,
                 (uint *)&gtest_ar_);
      if ((char)elem.tag == '\0') {
        testing::Message::Message((Message *)&gtest_ar__2);
        if (elem.vec.data_ == (unsigned_long *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = (char *)*elem.vec.data_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                   ,0x81,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar__2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
        if (gtest_ar__2._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&elem.vec);
      pTVar4 = local_248.data_;
      if (sVar2 == 0) {
LAB_002d39f3:
        abort();
      }
      Vector<unsigned_long>::~Vector(&local_248.data_[sVar2 - 1].vec);
      uVar7 = sVar2 - 1;
      gtest_ar_.success_ = true;
      gtest_ar_._1_3_ = 0;
      gtest_ar__2._0_8_ = uVar7;
      local_248.size_ = uVar7;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                ((internal *)&elem,"vec.size()","100u",(unsigned_long *)&gtest_ar__2,
                 (uint *)&gtest_ar_);
      if ((char)elem.tag == '\0') {
        testing::Message::Message((Message *)&gtest_ar__2);
        if (elem.vec.data_ == (unsigned_long *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = (char *)*elem.vec.data_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                   ,0x83,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar__2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
        if (gtest_ar__2._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&elem.vec);
      local_278.data_ = (TagAndArray *)0x0;
      local_278.size_ = 0;
      local_278.capacity_ = 0;
      Vector<TagAndArray>::clear(&local_278);
      sVar2 = local_278.capacity_;
      local_248.data_ = local_278.data_;
      local_278.data_ = pTVar4;
      local_278.capacity_ = local_248.capacity_;
      local_248.size_ = local_278.size_;
      local_248.capacity_ = sVar2;
      gtest_ar_.success_ = true;
      gtest_ar_._1_3_ = 0;
      gtest_ar__2._0_8_ = uVar7;
      local_278.size_ = uVar7;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                ((internal *)&elem,"vec_moved.size()","100u",(unsigned_long *)&gtest_ar__2,
                 (uint *)&gtest_ar_);
      if ((char)elem.tag == '\0') {
        testing::Message::Message((Message *)&gtest_ar__2);
        if (elem.vec.data_ == (unsigned_long *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = (char *)*elem.vec.data_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                   ,0x86,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar__2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
        if (gtest_ar__2._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&elem.vec);
      count = 0;
      pTVar8 = pTVar4 + uVar7;
      while (pTVar1 = local_278.data_, local_258 = pTVar4, pTVar4 != pTVar8) {
        if (local_278.size_ <= count) goto LAB_002d39f3;
        if (pTVar4 == local_278.data_ + count) {
          testing::AssertionSuccess();
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)&elem);
          if (local_258 == (TagAndArray *)0x0) {
            std::operator<<((ostream *)&elem.vec.size_,"NULL");
          }
          else {
            std::ostream::_M_insert<void_const*>(&elem.vec.size_);
          }
          std::__cxx11::stringbuf::str();
          std::__cxx11::stringstream::~stringstream((stringstream *)&elem);
          std::__cxx11::stringstream::stringstream((stringstream *)&elem);
          if (pTVar1 == (TagAndArray *)0x0) {
            std::operator<<((ostream *)&elem.vec.size_,"NULL");
          }
          else {
            std::ostream::_M_insert<void_const*>(&elem.vec.size_);
          }
          std::__cxx11::stringbuf::str();
          std::__cxx11::stringstream::~stringstream((stringstream *)&elem);
          testing::internal::EqFailure
                    ((internal *)&gtest_ar_4,"&elem","&vec_moved[count]",(string *)&gtest_ar__2,
                     (string *)&gtest_ar_,false);
          std::__cxx11::string::~string((string *)&gtest_ar_);
          std::__cxx11::string::~string((string *)&gtest_ar__2);
        }
        pTVar4 = local_258;
        if (gtest_ar_4.success_ == false) {
          testing::Message::Message((Message *)&elem);
          pcVar5 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_4.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar5 = *(char **)gtest_ar_4.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                     ,0x8a,pcVar5);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&elem);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
          if (elem.tag != 0) {
            (**(code **)(*(long *)elem.tag + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_4.message_);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)&elem,"elem.tag","count",&pTVar4->tag,&count);
        if ((char)elem.tag == '\0') {
          testing::Message::Message((Message *)&gtest_ar__2);
          pcVar5 = "";
          if (elem.vec.data_ != (unsigned_long *)0x0) {
            pcVar5 = (char *)*elem.vec.data_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                     ,0x8c,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar__2);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
          if (gtest_ar__2._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&elem.vec);
        gtest_ar__2._0_8_ = (pTVar4->vec).size_;
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)&elem,"elem.vec.size()","count",(unsigned_long *)&gtest_ar__2,&count)
        ;
        if ((char)elem.tag == '\0') {
          testing::Message::Message((Message *)&gtest_ar__2);
          pcVar5 = "";
          if (elem.vec.data_ != (unsigned_long *)0x0) {
            pcVar5 = (char *)*elem.vec.data_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                     ,0x8d,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar__2);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
          if (gtest_ar__2._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&elem.vec);
        for (gtest_ar__2._0_8_ = 0; (ulong)gtest_ar__2._0_8_ < count;
            gtest_ar__2._0_8_ = gtest_ar__2._0_8_ + 1) {
          lhs = Vector<unsigned_long>::operator[](&pTVar4->vec,gtest_ar__2._0_8_);
          testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                    ((internal *)&elem,"elem.vec[j]","j",lhs,(unsigned_long *)&gtest_ar__2);
          if ((char)elem.tag == '\0') {
            testing::Message::Message((Message *)&gtest_ar_);
            pcVar5 = "";
            if (elem.vec.data_ != (unsigned_long *)0x0) {
              pcVar5 = (char *)*elem.vec.data_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
                       ,0x8f,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar_);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
            if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&elem.vec);
        }
        count = count + 1;
        pTVar4 = local_258 + 1;
      }
      Vector<TagAndArray>::~Vector(&local_278);
      goto LAB_002d39eb;
    }
    testing::Message::Message((Message *)&gtest_ar_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&elem,(internal *)&gtest_ar__2,
               (AssertionResult *)"vec.Push(std::move(extra))","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_278,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x80,(char *)elem.tag);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_278,(Message *)&gtest_ar_);
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&elem,(internal *)&gtest_ar__2,(AssertionResult *)"extra.vec.Push(1234)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_278,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_test.cc"
               ,0x7f,(char *)elem.tag);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_278,(Message *)&gtest_ar_);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_278);
  std::__cxx11::string::~string((string *)&elem);
  if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
LAB_002d39eb:
  this_00 = &extra.vec;
LAB_002d30e8:
  Vector<unsigned_long>::~Vector(this_00);
  Vector<TagAndArray>::~Vector(&local_248);
  return;
}

Assistant:

TEST(InplaceVectorTest, ComplexType) {
  InplaceVector<std::vector<int>, 4> vec_of_vecs;
  const std::vector<int> data[] = {{1, 2, 3}, {4, 5, 6}, {7, 8, 9}};
  vec_of_vecs.CopyFrom(data);
  EXPECT_EQ(Span(vec_of_vecs), Span(data));

  vec_of_vecs.Resize(2);
  EXPECT_EQ(Span(vec_of_vecs), Span(data, 2));

  vec_of_vecs.PushBack({42});
  EXPECT_EQ(3u, vec_of_vecs.size());
  vec_of_vecs.pop_back();
  EXPECT_EQ(2u, vec_of_vecs.size());

  vec_of_vecs.Resize(4);
  EXPECT_EQ(4u, vec_of_vecs.size());
  EXPECT_EQ(vec_of_vecs[0], data[0]);
  EXPECT_EQ(vec_of_vecs[1], data[1]);
  EXPECT_TRUE(vec_of_vecs[2].empty());
  EXPECT_TRUE(vec_of_vecs[3].empty());

  // Copy-construction.
  InplaceVector<std::vector<int>, 4> vec_of_vecs2 = vec_of_vecs;
  EXPECT_EQ(4u, vec_of_vecs2.size());
  EXPECT_EQ(vec_of_vecs2[0], data[0]);
  EXPECT_EQ(vec_of_vecs2[1], data[1]);
  EXPECT_TRUE(vec_of_vecs2[2].empty());
  EXPECT_TRUE(vec_of_vecs2[3].empty());

  // Copy-assignment.
  InplaceVector<std::vector<int>, 4> vec_of_vecs3;
  vec_of_vecs3 = vec_of_vecs;
  EXPECT_EQ(4u, vec_of_vecs3.size());
  EXPECT_EQ(vec_of_vecs3[0], data[0]);
  EXPECT_EQ(vec_of_vecs3[1], data[1]);
  EXPECT_TRUE(vec_of_vecs3[2].empty());
  EXPECT_TRUE(vec_of_vecs3[3].empty());

  // Move-construction.
  InplaceVector<std::vector<int>, 4> vec_of_vecs4 = std::move(vec_of_vecs);
  EXPECT_EQ(4u, vec_of_vecs4.size());
  EXPECT_EQ(vec_of_vecs4[0], data[0]);
  EXPECT_EQ(vec_of_vecs4[1], data[1]);
  EXPECT_TRUE(vec_of_vecs4[2].empty());
  EXPECT_TRUE(vec_of_vecs4[3].empty());

  // The elements of the original vector should have been moved-from.
  EXPECT_EQ(4u, vec_of_vecs.size());
  for (const auto &vec : vec_of_vecs) {
    EXPECT_TRUE(vec.empty());
  }

  // Move-assignment.
  InplaceVector<std::vector<int>, 4> vec_of_vecs5;
  vec_of_vecs5 = std::move(vec_of_vecs4);
  EXPECT_EQ(4u, vec_of_vecs5.size());
  EXPECT_EQ(vec_of_vecs5[0], data[0]);
  EXPECT_EQ(vec_of_vecs5[1], data[1]);
  EXPECT_TRUE(vec_of_vecs5[2].empty());
  EXPECT_TRUE(vec_of_vecs5[3].empty());

  // The elements of the original vector should have been moved-from.
  EXPECT_EQ(4u, vec_of_vecs4.size());
  for (const auto &vec : vec_of_vecs4) {
    EXPECT_TRUE(vec.empty());
  }

  std::vector<int> v = {42};
  vec_of_vecs5.Resize(3);
  EXPECT_TRUE(vec_of_vecs5.TryPushBack(v));
  EXPECT_EQ(v, vec_of_vecs5[3]);
  EXPECT_FALSE(vec_of_vecs5.TryPushBack(v));
}